

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O0

greatest_test_res fr_routes(void)

{
  int iVar1;
  undefined1 local_e68 [8];
  route_t expected [5];
  route_t *prStack_20;
  int record_count;
  route_t *records;
  FILE *fp;
  
  records = (route_t *)fopen("../tests/data/google_sample/routes.txt","r");
  if (records == (route_t *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
    ;
    greatest_info.fail_line = 0x14f;
    greatest_info.msg = "Couldn\'t open `data/google_sample/routes.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    iVar1 = read_all_routes((FILE *)records,&stack0xffffffffffffffe0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 5) {
      memcpy(local_e68,&DAT_00244960,0xe38);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_route((route_t *)local_e68,prStack_20);
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x17a;
        greatest_info.msg = "equal_route(&(expected[0]), &(records[0]))";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        fp._4_4_ = GREATEST_TEST_RES_FAIL;
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_route((route_t *)(expected[0].text_color + 5),prStack_20 + 1);
        if (iVar1 == 0) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
          ;
          greatest_info.fail_line = 0x17b;
          greatest_info.msg = "equal_route(&(expected[1]), &(records[1]))";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          fp._4_4_ = GREATEST_TEST_RES_FAIL;
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_route((route_t *)(expected[1].text_color + 5),prStack_20 + 2);
          if (iVar1 == 0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
            ;
            greatest_info.fail_line = 0x17c;
            greatest_info.msg = "equal_route(&(expected[2]), &(records[2]))";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            fp._4_4_ = GREATEST_TEST_RES_FAIL;
          }
          else {
            free(prStack_20);
            if (records != (route_t *)0x0) {
              fclose((FILE *)records);
            }
            greatest_info.msg = (char *)0x0;
            fp._4_4_ = GREATEST_TEST_RES_PASS;
          }
        }
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      greatest_info.fail_line = 0x154;
      greatest_info.msg = "5 != record_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST fr_routes(void) {
    FILE *fp = fopen("../tests/data/google_sample/routes.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/google_sample/routes.txt` test file");
    } else {
        route_t *records;
        int record_count = read_all_routes(fp, &records);

        ASSERT_EQ(5, record_count);

        route_t expected[5] = {
            {
                .id = "AB",
                .agency_id = "DTA",
                .short_name = "10",
                .long_name = "Airport - Bullfrog",
                .desc = "",
                .type = RT_BUS,
                .url = "",
                .color = "",
                .text_color = ""
            },
            {
                .id = "BFC",
                .agency_id = "DTA",
                .short_name = "20",
                .long_name = "Bullfrog - Furnace Creek Resort",
                .desc = "",
                .type = RT_BUS,
                .url = "",
                .color = "",
                .text_color = ""
            },
            {
                .id = "STBA",
                .agency_id = "DTA",
                .short_name = "30",
                .long_name = "Stagecoach - Airport Shuttle",
                .desc = "",
                .type = RT_BUS,
                .url = "",
                .color = "",
                .text_color = ""
            }
        };

        ASSERT(equal_route(&(expected[0]), &(records[0])));
        ASSERT(equal_route(&(expected[1]), &(records[1])));
        ASSERT(equal_route(&(expected[2]), &(records[2])));

        if (record_count > 0) free(records);
        if (fp) fclose(fp);
    }
    PASS();
}